

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_overflow_strings_to_disk.cpp
# Opt level: O1

void __thiscall
duckdb::UncompressedStringSegmentState::RegisterBlock
          (UncompressedStringSegmentState *this,BlockManager *manager_p,block_id_t block_id)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  iterator __position;
  int iVar3;
  InternalException *this_00;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  shared_ptr<duckdb::BlockHandle,_true> sVar7;
  shared_ptr<duckdb::BlockHandle,_true> result;
  _Hash_node_base *local_60;
  undefined1 local_58 [16];
  string local_48;
  
  local_60 = (_Hash_node_base *)block_id;
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->block_lock);
  if (iVar3 != 0) {
    ::std::__throw_system_error(iVar3);
  }
  uVar1 = (this->handles)._M_h._M_bucket_count;
  uVar4 = (ulong)local_60 % uVar1;
  p_Var5 = (this->handles)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, local_60 != p_Var5->_M_nxt[1]._M_nxt)) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, local_60 == p_Var2[1]._M_nxt)) goto LAB_00c71366;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_00c71366:
  if ((p_Var6 != (__node_base_ptr)0x0) && (p_Var6->_M_nxt != (_Hash_node_base *)0x0)) {
    this_00 = (InternalException *)__cxa_allocate_exception(0x10);
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)(local_58 + 0x10),
               "UncompressedStringSegmentState::RegisterBlock - block id %llu already exists","");
    InternalException::InternalException<long>(this_00,(string *)(local_58 + 0x10),(long)local_60);
    __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  }
  if ((this->block_manager).ptr != (BlockManager *)0x0) {
    optional_ptr<duckdb::BlockManager,_true>::CheckValid(&this->block_manager);
    manager_p = (this->block_manager).ptr;
  }
  sVar7 = BlockManager::RegisterBlock((BlockManager *)local_58,(block_id_t)manager_p);
  local_48._M_dataplus._M_p = (pointer)local_60;
  local_48._M_string_length = local_58._0_8_;
  local_48.field_2._M_allocated_capacity = local_58._8_8_;
  local_58._0_8_ = (_func_int **)0x0;
  local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  ::std::
  _Hashtable<long,std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>,std::allocator<std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
  ::_M_emplace<std::pair<long,duckdb::shared_ptr<duckdb::BlockHandle,true>>>
            ((_Hashtable<long,std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>,std::allocator<std::pair<long_const,duckdb::shared_ptr<duckdb::BlockHandle,true>>>,std::__detail::_Select1st,std::equal_to<long>,std::hash<long>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
              *)&this->handles,local_58 + 0x10,
             sVar7.internal.super___shared_ptr<duckdb::BlockHandle,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.field_2._M_allocated_capacity !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               local_48.field_2._M_allocated_capacity);
  }
  __position._M_current =
       (this->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
       super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
      super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    ::std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
              ((vector<long,std::allocator<long>> *)&this->on_disk_blocks,__position,
               (long *)&local_60);
  }
  else {
    *__position._M_current = (long)local_60;
    (this->on_disk_blocks).super_vector<long,_std::allocator<long>_>.
    super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_finish =
         __position._M_current + 1;
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->block_lock);
  return;
}

Assistant:

void UncompressedStringSegmentState::RegisterBlock(BlockManager &manager_p, block_id_t block_id) {
	lock_guard<mutex> lock(block_lock);
	auto entry = handles.find(block_id);
	if (entry != handles.end()) {
		throw InternalException("UncompressedStringSegmentState::RegisterBlock - block id %llu already exists",
		                        block_id);
	}
	auto &manager = block_manager ? *block_manager : manager_p;
	auto result = manager.RegisterBlock(block_id);
	handles.insert(make_pair(block_id, std::move(result)));
	on_disk_blocks.push_back(block_id);
}